

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O3

void readRgba2(char *fileName)

{
  int iVar1;
  int iVar2;
  Box2i *pBVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  Rgba *base;
  long lVar7;
  size_t yStride;
  RgbaInputFile file;
  RgbaInputFile local_68;
  
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&local_68,fileName,iVar2);
  pBVar3 = Imf_2_5::RgbaInputFile::dataWindow(&local_68);
  lVar6 = (long)(pBVar3->min).x;
  iVar2 = (pBVar3->min).y;
  lVar5 = (long)iVar2;
  iVar1 = (pBVar3->max).y;
  lVar7 = (pBVar3->max).x - lVar6;
  yStride = lVar7 + 1;
  pvVar4 = operator_new__(-(ulong)((ulong)((lVar7 * 2 + 2) * 5) >> 0x3d != 0) | yStride * 0x50);
  if (iVar2 <= iVar1) {
    base = (Rgba *)((long)pvVar4 - (lVar6 * 8 + lVar5 * yStride * 8));
    do {
      Imf_2_5::RgbaInputFile::setFrameBuffer(&local_68,base,1,yStride);
      iVar2 = (int)lVar5 + 9;
      if (iVar1 < iVar2) {
        iVar2 = iVar1;
      }
      Imf_2_5::RgbaInputFile::readPixels(&local_68,(int)lVar5,iVar2);
      lVar5 = lVar5 + 10;
      base = base + yStride * -10;
    } while (lVar5 <= iVar1);
  }
  operator_delete__(pvVar4);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_68);
  return;
}

Assistant:

void
readRgba2 (const char fileName[])
{
    //
    // Read an RGBA image using class RgbaInputFile.
    // Read the pixels, 10 scan lines at a time, and
    // store the pixel data in a buffer that is just
    // large enough to hold 10 scan lines worth of data.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- for each block of 10 scan lines,
    //	  describe the memory layout of the pixels,
    //	  read the pixels from the file,
    //	  process the pixels and discard them
    //

    RgbaInputFile file (fileName);
    Box2i dw = file.dataWindow();

    int width  = dw.max.x - dw.min.x + 1;

    Array2D<Rgba> pixels (10, width);

    while (dw.min.y <= dw.max.y)
    {
	file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width,
			     1, width);

	file.readPixels (dw.min.y, min (dw.min.y + 9, dw.max.y));
	// processPixels (pixels)
	
	dw.min.y += 10;
    }
}